

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O0

void tcptran_dial_cb(void *arg)

{
  nng_stream *conn_00;
  nng_stream *conn;
  tcptran_pipe *ptStack_28;
  int rv;
  tcptran_pipe *p;
  nni_aio *aio;
  tcptran_ep *ep;
  void *arg_local;
  
  p = (tcptran_pipe *)((long)arg + 0x50);
  aio = (nni_aio *)arg;
  ep = (tcptran_ep *)arg;
  nni_mtx_lock((nni_mtx *)arg);
  conn._4_4_ = nni_aio_result((nni_aio *)p);
  if (conn._4_4_ == NNG_OK) {
    conn_00 = (nng_stream *)nni_aio_get_output((nni_aio *)p,0);
    if (((ulong)(aio->a_task).task_cb & 0x10000) == 0) {
      conn._4_4_ = nni_pipe_alloc_dialer
                             (&stack0xffffffffffffffd8,
                              *(nni_dialer **)((long)&aio[2].a_task.task_cv.cv + 0x20));
      if (conn._4_4_ == NNG_OK) {
        tcptran_pipe_start(ptStack_28,conn_00,(tcptran_ep *)aio);
        nni_mtx_unlock((nni_mtx *)aio);
        return;
      }
      nng_stream_free(conn_00);
    }
    else {
      nng_stream_free(conn_00);
      conn._4_4_ = NNG_ECLOSED;
    }
  }
  p = *(tcptran_pipe **)&(aio->a_task).task_busy;
  if (p != (tcptran_pipe *)0x0) {
    (aio->a_task).task_busy = 0;
    (aio->a_task).task_prep = false;
    *(undefined3 *)&(aio->a_task).field_0x2d = 0;
    nni_aio_finish_error((nni_aio *)p,conn._4_4_);
  }
  nni_mtx_unlock((nni_mtx *)aio);
  return;
}

Assistant:

static void
tcptran_dial_cb(void *arg)
{
	tcptran_ep   *ep  = arg;
	nni_aio      *aio = &ep->connaio;
	tcptran_pipe *p;
	int           rv;
	nng_stream   *conn;

	nni_mtx_lock(&ep->mtx);
	if ((rv = nni_aio_result(aio)) != 0) {
		goto error;
	}

	conn = nni_aio_get_output(aio, 0);

	if (ep->closed) {
		nng_stream_free(conn);
		rv = NNG_ECLOSED;
		goto error;
	}
	if ((rv = nni_pipe_alloc_dialer((void **) &p, ep->ndialer)) != 0) {
		nng_stream_free(conn);
		goto error;
	}
	tcptran_pipe_start(p, conn, ep);
	nni_mtx_unlock(&ep->mtx);
	return;

error:
	// Error connecting.  We need to pass this straight back
	// to the user.
	if ((aio = ep->useraio) != NULL) {
		ep->useraio = NULL;
		nni_aio_finish_error(aio, rv);
	}
	nni_mtx_unlock(&ep->mtx);
}